

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O1

void __thiscall
ODDLParser::OpenDDLParserTest_parseDataListTest_Test::TestBody
          (OpenDDLParserTest_parseDataListTest_Test *this)

{
  undefined1 *puVar1;
  internal iVar2;
  Reference *pRVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  _List_node_base *p_Var8;
  Value *pVVar9;
  Value *pVVar10;
  long lVar11;
  Reference **ppRVar12;
  string *psVar13;
  AssertHelperData *pAVar14;
  undefined1 *puVar15;
  long *plVar16;
  AssertionResult gtest_ar__3;
  Value *data;
  char token2 [23];
  list<int,_std::allocator<int>_> expValues;
  string expStrings [2];
  Reference *refs;
  int res;
  size_t numValues;
  char token1 [10];
  size_t numRefs;
  AssertHelper local_108;
  AssertHelper local_100;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  Value *local_f0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_e0;
  undefined7 uStack_d8;
  AssertHelper local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  long local_b0;
  string local_a8;
  long *local_88 [2];
  long local_78 [3];
  Reference *local_60;
  int local_54;
  size_t local_50;
  undefined8 local_48;
  undefined2 local_40;
  size_t local_38;
  
  local_f0 = (Value *)0x0;
  local_48 = 0x342c332c322c317b;
  local_40 = 0x7d;
  sVar6 = strlen((char *)&local_48);
  ppRVar12 = &local_60;
  local_60 = (Reference *)0x0;
  local_38 = 0;
  local_50 = 0;
  pcVar7 = OpenDDLParser::parseDataList
                     ((char *)&local_48,(char *)((long)&local_48 + sVar6),ddl_none,&local_f0,
                      &local_50,ppRVar12,&local_38);
  iVar2 = (internal)(pcVar7 != (char *)0x0);
  local_b8 = (undefined1 *)0x0;
  local_c0._0_1_ = iVar2;
  if (pcVar7 == (char *)0x0) {
    testing::Message::Message((Message *)&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_c0,(AssertionResult *)"nullptr == in","true","false",
               (char *)ppRVar12);
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x26f,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_e8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_e8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_e8.ptr_ + 8))();
      }
      local_e8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_c0 = (undefined1 *)CONCAT71(local_c0._1_7_,local_f0 != (Value *)0x0);
    local_b8 = (undefined1 *)0x0;
    if (local_f0 == (Value *)0x0) {
      testing::Message::Message((Message *)&local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a8,(internal *)&local_c0,(AssertionResult *)"nullptr == data","true","false"
                 ,(char *)ppRVar12);
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                 ,0x270,local_a8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (local_e8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (local_e8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_e8.ptr_ + 8))();
        }
        local_e8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_c0 = (undefined1 *)&local_c0;
      local_b0 = 0;
      local_b8 = local_c0;
      p_Var8 = (_List_node_base *)operator_new(0x18);
      *(undefined4 *)&p_Var8[1]._M_next = 1;
      std::__detail::_List_node_base::_M_hook(p_Var8);
      local_b0 = local_b0 + 1;
      p_Var8 = (_List_node_base *)operator_new(0x18);
      *(undefined4 *)&p_Var8[1]._M_next = 2;
      std::__detail::_List_node_base::_M_hook(p_Var8);
      local_b0 = local_b0 + 1;
      p_Var8 = (_List_node_base *)operator_new(0x18);
      *(undefined4 *)&p_Var8[1]._M_next = 3;
      std::__detail::_List_node_base::_M_hook(p_Var8);
      local_b0 = local_b0 + 1;
      p_Var8 = (_List_node_base *)operator_new(0x18);
      *(undefined4 *)&p_Var8[1]._M_next = 4;
      std::__detail::_List_node_base::_M_hook(p_Var8);
      pVVar10 = local_f0;
      local_b0 = local_b0 + 1;
      local_100.data_._0_4_ = 4;
      if (local_f0 == (Value *)0x0) {
        local_e8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      else {
        pVVar9 = Value::getNext(local_f0);
        local_e8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        while (pVVar9 != (Value *)0x0) {
          pVVar10 = Value::getNext(pVVar10);
          pVVar9 = Value::getNext(pVVar10);
          local_e8.ptr_ = local_e8.ptr_ + 1;
        }
      }
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)&local_a8,"4U","countItems(data)",(uint *)&local_100,
                 (unsigned_long *)&local_e8);
      if ((char)local_a8._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_e8);
        if ((undefined8 *)local_a8._M_string_length == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)local_a8._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_100,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                   ,0x278,pcVar7);
        testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_e8);
        testing::internal::AssertHelper::~AssertHelper(&local_100);
        if (local_e8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             (local_e8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_e8.ptr_ + 8))();
          }
          local_e8.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_a8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      puVar15 = local_c0;
      pVVar10 = local_f0;
      if (((local_f0 == (Value *)0x0) || (local_f0->m_type != ddl_int32)) ||
         (iVar5 = bcmp(local_f0->m_data,(void *)((long)local_c0 + 0x10),local_f0->m_size),
         iVar5 != 0)) {
        bVar4 = false;
      }
      else {
        do {
          pVVar10 = Value::getNext(pVVar10);
          bVar4 = pVVar10 == (Value *)0x0;
          if (bVar4) break;
          puVar15 = *(undefined1 **)puVar15;
          iVar5 = bcmp(pVVar10->m_data,puVar15 + 0x10,pVVar10->m_size);
        } while (iVar5 == 0);
      }
      local_e8.ptr_._0_1_ = bVar4;
      sStack_e0.ptr_._0_7_ = 0;
      sStack_e0.ptr_._7_1_ = 0;
      if (bVar4 == false) {
        testing::Message::Message((Message *)&local_100);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_a8,(internal *)&local_e8,
                   (AssertionResult *)"testValues(Value::ValueType::ddl_int32, data, expValues)",
                   "false","true",(char *)ppRVar12);
        testing::internal::AssertHelper::AssertHelper
                  (&local_108,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                   ,0x279,local_a8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
        testing::internal::AssertHelper::~AssertHelper(&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if (local_100.data_ != (AssertHelperData *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) && (local_100.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_100.data_ + 8))();
          }
          local_100.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      OpenDDLParserTest::registerValueForDeletion(&this->super_OpenDDLParserTest,local_f0);
      pRVar3 = local_60;
      if (local_60 != (Reference *)0x0) {
        Reference::~Reference(local_60);
        operator_delete(pRVar3,0x10);
      }
      local_e8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           0x6e6972747322207b;
      sStack_e0.ptr_._0_7_ = 0x7473222c223167;
      sStack_e0.ptr_._7_1_ = 0x72;
      uStack_d8 = 0x7d2232676e69;
      sVar6 = strlen((char *)&local_e8);
      ppRVar12 = &local_60;
      OpenDDLParser::parseDataList
                ((char *)&local_e8,(char *)((long)&local_e8.ptr_ + sVar6),ddl_none,&local_f0,
                 &local_50,ppRVar12,&local_38);
      local_100.data_._0_1_ = (internal)(local_f0 != (Value *)0x0);
      local_f8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_f0 == (Value *)0x0) {
        testing::Message::Message((Message *)&local_108);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_a8,(internal *)&local_100,(AssertionResult *)"nullptr == data","true",
                   "false",(char *)ppRVar12);
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                   ,0x280,local_a8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_108);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if (local_108.data_ != (AssertHelperData *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) && (local_108.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_108.data_ + 8))();
          }
          local_108.data_ = (AssertHelperData *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        pVVar10 = local_f0;
        local_108.data_._0_4_ = 2;
        if (local_f0 == (Value *)0x0) {
          pAVar14 = (AssertHelperData *)0x0;
        }
        else {
          pVVar9 = Value::getNext(local_f0);
          pAVar14 = (AssertHelperData *)0x1;
          while (pVVar9 != (Value *)0x0) {
            pVVar10 = Value::getNext(pVVar10);
            pVVar9 = Value::getNext(pVVar10);
            pAVar14 = (AssertHelperData *)((long)&pAVar14->type + 1);
          }
        }
        local_100.data_ = pAVar14;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  ((internal *)&local_a8,"2U","countItems(data)",(uint *)&local_108,
                   (unsigned_long *)&local_100);
        if ((char)local_a8._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_100);
          if ((undefined8 *)local_a8._M_string_length == (undefined8 *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)local_a8._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_108,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                     ,0x283,pcVar7);
          testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
          testing::internal::AssertHelper::~AssertHelper(&local_108);
          if (local_100.data_ != (AssertHelperData *)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) && (local_100.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_100.data_ + 8))();
            }
            local_100.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_a8._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"string1","");
        plVar16 = local_78;
        local_88[0] = plVar16;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"string2","");
        if (local_f0 != (Value *)0x0) {
          psVar13 = &local_a8;
          do {
            local_54 = strncmp((psVar13->_M_dataplus)._M_p,(char *)local_f0->m_data,local_f0->m_size
                              );
            local_108.data_ = local_108.data_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&local_100,"0","res",(int *)&local_108,&local_54);
            if (local_100.data_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_108);
              pcVar7 = "";
              if (local_f8.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar7 = ((local_f8.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_c8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                         ,0x28b,pcVar7);
              testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_108);
              testing::internal::AssertHelper::~AssertHelper(&local_c8);
              if (local_108.data_ != (AssertHelperData *)0x0) {
                bVar4 = testing::internal::IsTrue(true);
                if ((bVar4) && (local_108.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_108.data_ + 8))();
                }
                local_108.data_ = (AssertHelperData *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_f8,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_f0 = local_f0->m_next;
            psVar13 = psVar13 + 1;
          } while (local_f0 != (Value *)0x0);
        }
        pRVar3 = local_60;
        if (local_60 != (Reference *)0x0) {
          Reference::~Reference(local_60);
          operator_delete(pRVar3,0x10);
        }
        lVar11 = -0x40;
        do {
          if (plVar16 != (long *)plVar16[-2]) {
            operator_delete((long *)plVar16[-2],*plVar16 + 1);
          }
          plVar16 = plVar16 + -4;
          lVar11 = lVar11 + 0x20;
        } while (lVar11 != 0);
      }
      puVar15 = local_c0;
      while ((undefined1 **)puVar15 != &local_c0) {
        puVar1 = *(undefined1 **)puVar15;
        operator_delete(puVar15,0x18);
        puVar15 = puVar1;
      }
    }
  }
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, parseDataListTest) {
    Value *data(nullptr);
    size_t len(0);

    char *in(nullptr), *end(nullptr);
    char token1[] = "{1,2,3,4}";
    end = findEnd(token1, len);
    Reference *refs(nullptr);
    size_t numRefs(0), numValues(0);
    Value::ValueType type(Value::ValueType::ddl_none);
    in = OpenDDLParser::parseDataList(token1, end, type, &data, numValues, &refs, numRefs);
    ASSERT_FALSE(nullptr == in);
    ASSERT_FALSE(nullptr == data);

    // check intrinsic list with integers
    std::list<int> expValues;
    expValues.push_back(1);
    expValues.push_back(2);
    expValues.push_back(3);
    expValues.push_back(4);
    EXPECT_EQ(4U, countItems(data));
    EXPECT_TRUE(testValues(Value::ValueType::ddl_int32, data, expValues));
    registerValueForDeletion(data);
    delete refs;

    char token2[] = "{ \"string1\",\"string2\"}";
    end = findEnd(token2, len);
    in = OpenDDLParser::parseDataList(token2, end, type, &data, numValues, &refs, numRefs);
    ASSERT_FALSE(nullptr == data);

    // check intrinsic list with strings
    EXPECT_EQ(2U, countItems(data));
    std::string expStrings[2] = {
        "string1",
        "string2"
    };
    size_t i(0);
    while (nullptr != data) {
        const int res(strncmp(expStrings[i].c_str(), (char *)data->m_data, data->m_size));
        EXPECT_EQ(0, res);
        data = data->m_next;
        i++;
    }
    registerValueForDeletion(data);
    delete refs;
}